

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationIndex.cpp
# Opt level: O2

unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
 __thiscall
VariationIndex::_getDeletions(VariationIndex *this,int chromosome_id,size_t start,size_t end)

{
  table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>,_int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>_>_>
  *this_00;
  long lVar1;
  pointer __p;
  node_pointer ppVar2;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
  iVar3;
  ulong uVar4;
  ulong uVar5;
  node_pointer ppVar6;
  pointer __p_00;
  int iVar7;
  long lVar8;
  undefined4 in_register_00000034;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  ulong in_R8;
  emplace_return eVar9;
  int chromosome_id_local;
  ulong local_70;
  __uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_68;
  unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  candidates;
  
  chromosome_id_local = (int)start;
  this_00 = (table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>,_int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>_>_>
             *)(CONCAT44(in_register_00000034,chromosome_id) + 0x10);
  ppVar2 = boost::unordered::detail::
           table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>,_int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>_>_>
           ::find_node(this_00,&chromosome_id_local);
  if (ppVar2 != (node_pointer)0x0) {
    eVar9 = boost::unordered::detail::
            table<boost::unordered::detail::map<std::allocator<std::pair<int_const,VariationIndex::chromosome_record_t>>,int,VariationIndex::chromosome_record_t,boost::hash<int>,std::equal_to<int>>>
            ::try_emplace_unique<int_const&>
                      ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,VariationIndex::chromosome_record_t>>,int,VariationIndex::chromosome_record_t,boost::hash<int>,std::equal_to<int>>>
                        *)this_00,&chromosome_id_local);
    iVar3 = eVar9.first.node_;
    uVar4 = (end - 1) / *(ulong *)(CONCAT44(in_register_00000034,chromosome_id) + 0x78);
    if (uVar4 < (ulong)(*(long *)((long)&((iVar3.node_)->value_base_).data_.data_ + 0x28) -
                        *(long *)((long)&((iVar3.node_)->value_base_).data_.data_ + 0x20) >> 5)) {
      boost::unordered::
      unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::unordered_set(&candidates);
      this->_vptr_VariationIndex = (_func_int **)0x0;
      uVar4 = *(ulong *)(*(long *)((long)&((iVar3.node_)->value_base_).data_.data_ + 0x20) +
                        uVar4 * 0x20);
      local_70 = end;
      for (lVar8 = uVar4 * 0x18 + 8;
          (lVar1 = *(long *)((long)&((iVar3.node_)->value_base_).data_.data_ + 8),
          uVar4 < (ulong)((*(long *)((long)&((iVar3.node_)->value_base_).data_.data_ + 0x10) - lVar1
                          ) / 0x18) && (uVar5 = *(ulong *)(lVar1 + -8 + lVar8), uVar5 <= in_R8));
          lVar8 = lVar8 + 0x18) {
        iVar7 = *(int *)(lVar1 + 8 + lVar8);
        if ((uVar5 == end) && (iVar7 == 1)) {
          boost::unordered::
          unordered_set<unsigned_long,boost::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
          ::emplace<unsigned_long_const&>(&candidates,(unsigned_long *)(lVar8 + lVar1));
          uVar5 = *(ulong *)(lVar1 + -8 + lVar8);
          iVar7 = *(int *)(lVar1 + 8 + lVar8);
        }
        if ((uVar5 == in_R8) && (iVar7 == 2)) {
          ppVar6 = boost::unordered::detail::
                   table<boost::unordered::detail::set<std::allocator<unsigned_long>,_unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>_>_>
                   ::find_node(&candidates.table_,(value_type_conflict3 *)(lVar1 + lVar8));
          if (ppVar6 != (node_pointer)0x0) {
            this_01 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      this->_vptr_VariationIndex;
            if (this_01 == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
              __p_00 = (pointer)operator_new(0x18);
              (__p_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (__p_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (__p_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_68._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_false>
              ._M_head_impl =
                   (tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      )0x0;
              std::
              __uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::reset((__uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       *)this,__p_00);
              std::
              unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::~unique_ptr((unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             *)&local_68);
              this_01 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        this->_vptr_VariationIndex;
              end = local_70;
            }
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      (this_01,(value_type_conflict3 *)(lVar1 + lVar8));
          }
        }
        uVar4 = uVar4 + 1;
      }
      boost::unordered::detail::
      table<boost::unordered::detail::set<std::allocator<unsigned_long>,_unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>_>_>
      ::~table(&candidates.table_);
      return (__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
              )(__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
                )this;
    }
  }
  this->_vptr_VariationIndex = (_func_int **)0x0;
  return (__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<std::vector<size_t> > VariationIndex::_getDeletions(int chromosome_id, size_t start, size_t end) {
	if (chromosomes.find(chromosome_id) == chromosomes.end()) {
		return unique_ptr<vector<size_t> >(nullptr);
	}
	const chromosome_record_t& chromosome_record = chromosomes[chromosome_id];
	size_t k = (start-1) / step_size;
	if (chromosome_record.checkpoint_list.size() <= k) {
		return unique_ptr<vector<size_t> >(nullptr);
	}
	const vector<event_t>& event_list = chromosome_record.events;
	boost::unordered_set<size_t> candidates;
	unique_ptr<vector<size_t> > result(nullptr);
	for (size_t i=chromosome_record.checkpoint_list[k].index; i<event_list.size(); ++i) {
		const event_t& event = event_list[i];
		if (event.position > end) break;
		if ((event.position == start) && (event.type == DELETION_START)) {
			candidates.insert(event.variation_index);
		}
		if ((event.position == end) && (event.type == DELETION_END)) {
			if (candidates.find(event.variation_index) != candidates.end()) {
				if (result.get() == 0) {
					result = unique_ptr<vector<size_t> >(new vector<size_t>());
				}
				result->push_back(event.variation_index);
			}
		}
	}
	return result;
}